

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_srv.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int ret;
  timespec ts;
  isobusfs_srv_priv *priv;
  char **in_stack_000001a8;
  int in_stack_000001b4;
  isobusfs_srv_priv *in_stack_000001b8;
  isobusfs_srv_priv *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  timespec local_28;
  isobusfs_srv_priv *local_18;
  int local_4;
  
  local_4 = 0;
  local_18 = (isobusfs_srv_priv *)malloc(0x16c2c0);
  if (local_18 == (isobusfs_srv_priv *)0x0) {
    err(1);
  }
  memset(local_18,0,0x16c2c0);
  libj1939_init_sockaddr_can(&local_18->addr,0x40000);
  local_18->server_version = 4;
  iVar1 = isobusfs_srv_parse_args(in_stack_000001b8,in_stack_000001b4,in_stack_000001a8);
  if ((iVar1 == 0) && (iVar1 = isobusfs_srv_sock_prepare(in_stack_ffffffffffffffc8), iVar1 == 0)) {
    isobusfs_srv_fss_init((isobusfs_srv_priv *)(ulong)in_stack_ffffffffffffffd0);
    isobusfs_srv_init_clients(local_18);
    clock_gettime(1,&local_28);
    (local_18->cmn).next_send_time.tv_sec = local_28.tv_sec;
    (local_18->cmn).next_send_time.tv_nsec = local_28.tv_nsec;
    isobusfs_log(3,"Starting isobusfs-srv");
    do {
      iVar1 = isobusfs_srv_process_events_and_tasks(in_stack_ffffffffffffffc8);
    } while (iVar1 == 0);
    close((local_18->cmn).epoll_fd);
    free((local_18->cmn).epoll_events);
    close(local_18->sock_fss);
    close(local_18->sock_in);
    close(local_18->sock_nack);
  }
  local_4 = iVar1;
  return local_4;
}

Assistant:

int main(int argc, char *argv[])
{
	struct isobusfs_srv_priv *priv;
	struct timespec ts;
	int ret;

	/* Allocate memory for the private structure */
	priv = malloc(sizeof(*priv));
	if (!priv)
		err(EXIT_FAILURE, "can't allocate priv");

	/* Clear memory for the private structure */
	memset(priv, 0, sizeof(*priv));

	/* Initialize sockaddr_can with a non-configurable PGN */
	libj1939_init_sockaddr_can(&priv->addr, J1939_NO_PGN);

	priv->server_version = ISOBUSFS_SRV_VERSION;
	/* Parse command line arguments */
	ret = isobusfs_srv_parse_args(priv, argc, argv);
	if (ret)
		return ret;

	/* Prepare sockets for the server */
	ret = isobusfs_srv_sock_prepare(priv);
	if (ret)
		return ret;

	/* Initialize File Server Status structure */
	isobusfs_srv_fss_init(priv);
	/* Initialize client structures */
	isobusfs_srv_init_clients(priv);

	/* Init next st_next_send_time value to avoid warnings */
	clock_gettime(CLOCK_MONOTONIC, &ts);
	priv->cmn.next_send_time = ts;

	/* Start the isobusfsd server */
	pr_info("Starting isobusfs-srv");
	while (1) {
		ret = isobusfs_srv_process_events_and_tasks(priv);
		if (ret)
			break;
	}

	/* Close epoll and control sockets */
	close(priv->cmn.epoll_fd);
	free(priv->cmn.epoll_events);
	close(priv->sock_fss);
	close(priv->sock_in);
	close(priv->sock_nack);

	return ret;
}